

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIff.c
# Opt level: O1

void Gia_ManIffTest(Gia_Man_t *pGia,If_LibLut_t *pLib,int fVerbose)

{
  int *__ptr;
  int iVar1;
  Iff_Man_t *p;
  Vec_Int_t *pVVar2;
  char *__s;
  undefined8 uVar3;
  undefined8 uVar4;
  Tim_Man_t *pTemp;
  Tim_Man_t *local_30;
  
  local_30 = (Tim_Man_t *)0x0;
  iVar1 = Gia_ManLutSizeMax(pGia);
  if (iVar1 < 5) {
    uVar4 = 4;
    if (pLib->LutMax == 7) {
LAB_006f4716:
      uVar3 = 2;
      goto LAB_006f471c;
    }
    if (pLib->LutMax != 10) {
      __s = "LUT library for packing 4-LUTs should have 7 or 10 inputs.";
      goto LAB_006f4820;
    }
  }
  else {
    if (6 < iVar1) {
      __s = "The LUT size is more than 6.";
LAB_006f4820:
      puts(__s);
      return;
    }
    uVar4 = 6;
    if (pLib->LutMax == 0xb) goto LAB_006f4716;
    if (pLib->LutMax != 0x10) {
      __s = "LUT library for packing 6-LUTs should have 11 or 16 inputs.";
      goto LAB_006f4820;
    }
  }
  uVar3 = 3;
LAB_006f471c:
  if (fVerbose != 0) {
    printf("Performing %d-clustering with %d-LUTs:\n",uVar3,uVar4);
  }
  if (pGia->pManTime == (void *)0x0) {
    local_30 = Tim_ManStart(pGia->vCis->nSize,pGia->vCos->nSize);
    pGia->pManTime = local_30;
  }
  p = Gia_ManIffPerform(pGia,pLib,(Tim_Man_t *)pGia->pManTime,(int)uVar4,(int)uVar3);
  if ((Tim_Man_t *)pGia->pManTime == local_30) {
    pGia->pManTime = (void *)0x0;
  }
  Tim_ManStopP(&local_30);
  if (pGia->vPacking != (Vec_Int_t *)0x0) {
    __ptr = pGia->vPacking->pArray;
    if (__ptr != (int *)0x0) {
      free(__ptr);
      pGia->vPacking->pArray = (int *)0x0;
    }
    if (pGia->vPacking != (Vec_Int_t *)0x0) {
      free(pGia->vPacking);
      pGia->vPacking = (Vec_Int_t *)0x0;
    }
  }
  pVVar2 = Gia_ManIffSelect(p);
  pGia->vPacking = pVVar2;
  Gia_ManIffStop(p);
  if (fVerbose != 0) {
    Gia_ManPrintPackingStats(pGia);
  }
  return;
}

Assistant:

void Gia_ManIffTest( Gia_Man_t * pGia, If_LibLut_t * pLib, int fVerbose )
{
    Iff_Man_t * p;
    Tim_Man_t * pTemp = NULL;
    int nDegree = -1;
    int nLutSize = Gia_ManLutSizeMax( pGia );
    if ( nLutSize <= 4 )
    {
        nLutSize = 4;
        if ( pLib->LutMax == 7 )
            nDegree = 2;
        else if ( pLib->LutMax == 10 )
            nDegree = 3;
        else
            { printf( "LUT library for packing 4-LUTs should have 7 or 10 inputs.\n" ); return; }
    }
    else if ( nLutSize <= 6 )
    {
        nLutSize = 6;
        if ( pLib->LutMax == 11 )
            nDegree = 2;
        else if ( pLib->LutMax == 16 )
            nDegree = 3;
        else
            { printf( "LUT library for packing 6-LUTs should have 11 or 16 inputs.\n" ); return; }
    }
    else
    {
        printf( "The LUT size is more than 6.\n" );
        return;
    }
    if ( fVerbose )
        printf( "Performing %d-clustering with %d-LUTs:\n", nDegree, nLutSize );
    // create timing manager
    if ( pGia->pManTime == NULL )
        pGia->pManTime = pTemp = Tim_ManStart( Gia_ManCiNum(pGia), Gia_ManCoNum(pGia) );
    // perform timing computation
    p = Gia_ManIffPerform( pGia, pLib, (Tim_Man_t *)pGia->pManTime, nLutSize, nDegree );
    // remove timing manager
    if ( pGia->pManTime == pTemp )
        pGia->pManTime = NULL;
    Tim_ManStopP( (Tim_Man_t **)&pTemp );
    // derive clustering
    Vec_IntFreeP( &pGia->vPacking );
    pGia->vPacking = Gia_ManIffSelect( p );
    Gia_ManIffStop( p );
    // print statistics
    if ( fVerbose )
        Gia_ManPrintPackingStats( pGia );
}